

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcard_mt.cpp
# Opt level: O1

vector<bool,_std::allocator<bool>_> * __thiscall
xcardMT::validateFromFile
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,xcardMT *this,ifstream *fp)

{
  uint uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  _Bit_type *p_Var4;
  undefined1 auVar5 [8];
  long lVar6;
  undefined1 *puVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  char cVar10;
  int iVar11;
  istream *piVar12;
  long *plVar13;
  undefined8 *puVar14;
  void *__s;
  ulong uVar15;
  undefined4 *puVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  undefined8 *puVar20;
  ulong uVar21;
  long lVar22;
  _Bvector_base<std::allocator<bool>_> _Stack_110;
  undefined1 auStack_e8 [8];
  code *local_e0;
  undefined8 local_d8;
  undefined1 local_d0 [8];
  string buf;
  xcardMT *local_a8;
  vector<bool,_std::allocator<bool>_> *local_a0;
  undefined1 *local_98;
  undefined4 *local_90;
  undefined1 *local_88;
  ulong local_80;
  undefined1 auStack_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  card_storage;
  
  local_d0 = (undefined1  [8])&buf._M_string_length;
  iVar19 = 0;
  buf._M_dataplus._M_p = (pointer)0x0;
  buf._M_string_length._0_1_ = 0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  while( true ) {
    _Stack_110._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x1052e5;
    cVar10 = std::ios::widen((char)*(undefined8 *)(*(long *)fp + -0x18) + (char)fp);
    _Stack_110._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x1052f3;
    piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)fp,(string *)local_d0,cVar10);
    if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) break;
    iVar19 = iVar19 + 1;
  }
  _Stack_110._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x105317;
  std::ios::clear((int)*(undefined8 *)(*(long *)fp + -0x18) + (int)fp);
  _Stack_110._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x105323;
  std::istream::seekg((long)fp,_S_beg);
  if (this->max_threads < 1) {
    _Stack_110._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x105334;
    iVar11 = std::thread::hardware_concurrency();
    this->max_threads = iVar11;
  }
  local_80 = (ulong)(uint)this->max_threads;
  lVar6 = -(local_80 * 0x28 + 0xf & 0xfffffffffffffff0);
  puVar20 = (undefined8 *)(auStack_e8 + lVar6);
  local_88 = auStack_e8;
  if (local_80 != 0) {
    lVar22 = local_80 * 5;
    puVar14 = puVar20;
    local_88 = auStack_e8;
    do {
      *puVar14 = 0;
      *(undefined4 *)(puVar14 + 1) = 0;
      puVar14[2] = 0;
      *(undefined4 *)(puVar14 + 3) = 0;
      puVar14[4] = 0;
      puVar14 = puVar14 + 5;
    } while (puVar14 != puVar20 + lVar22);
  }
  if ((this->super_xcard).debug != 0) {
    *(undefined8 *)(auStack_e8 + lVar6 + -8) = 0x1053af;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[DEBUG] TotalLines=",0x13);
    *(undefined8 *)(auStack_e8 + lVar6 + -8) = 0x1053bf;
    plVar13 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar19);
    uVar3 = *(undefined8 *)(*plVar13 + -0x18);
    *(undefined8 *)(auStack_e8 + lVar6 + -8) = 0x1053d6;
    std::ios::widen((char)uVar3 + (char)plVar13);
    *(undefined8 *)(auStack_e8 + lVar6 + -8) = 0x1053e1;
    std::ostream::put((char)plVar13);
    *(undefined8 *)(auStack_e8 + lVar6 + -8) = 0x1053e9;
    std::ostream::flush();
    *(undefined8 *)(auStack_e8 + lVar6 + -8) = 0x105401;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[DEBUG] max_threads=",0x14);
    iVar11 = this->max_threads;
    *(undefined8 *)(auStack_e8 + lVar6 + -8) = 0x105412;
    plVar13 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar11);
    uVar3 = *(undefined8 *)(*plVar13 + -0x18);
    *(undefined8 *)(auStack_e8 + lVar6 + -8) = 0x105429;
    std::ios::widen((char)uVar3 + (char)plVar13);
    *(undefined8 *)(auStack_e8 + lVar6 + -8) = 0x105434;
    std::ostream::put((char)plVar13);
    *(undefined8 *)(auStack_e8 + lVar6 + -8) = 0x10543c;
    std::ostream::flush();
  }
  local_90 = (undefined4 *)(local_d0 + lVar6);
  local_98 = (undefined1 *)puVar20;
  do {
    iVar11 = iVar19 / this->max_threads;
    if (iVar11 <= this->max_threads) {
      this->max_threads = 1;
      iVar11 = iVar19;
    }
    uVar21 = (ulong)(uint)this->max_threads;
    __s = (void *)((long)local_98 - (uVar21 * 8 + 0xf & 0xfffffffffffffff0));
    if (uVar21 != 0) {
      *(undefined8 *)((long)__s + -8) = 0x1054a4;
      memset(__s,0,uVar21 * 8);
    }
    if (this->max_threads != 0) {
      uVar15 = 0;
      do {
        auStack_78 = (undefined1  [8])0x0;
        card_storage.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        card_storage.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        iVar17 = 0;
        iVar18 = iVar17;
        if (0 < iVar11) {
          do {
            lVar22 = *(long *)(*(long *)fp + -0x18);
            iVar18 = iVar17;
            if (((byte)fp[lVar22 + 0x20] & 2) != 0) break;
            *(undefined8 *)((long)__s + -8) = 0x1054e9;
            cVar10 = std::ios::widen((char)lVar22 + (char)fp);
            *(undefined8 *)((long)__s + -8) = 0x1054fb;
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)fp,(string *)local_d0,cVar10);
            *(undefined8 *)((long)__s + -8) = 0x10550b;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_78,(value_type *)local_d0);
            iVar17 = iVar17 + 1;
            iVar18 = iVar11;
          } while (iVar11 != iVar17);
        }
        local_e0 = runner;
        local_d8 = 0;
        local_a0 = (vector<bool,_std::allocator<bool>_> *)(puVar20 + uVar15 * 5);
        local_a8 = this;
        *(undefined8 *)((long)__s + -8) = 0x105572;
        std::thread::
        thread<void(xcardMT::*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<bool,std::allocator<bool>>*),xcardMT*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<bool,std::allocator<bool>>*,void>
                  ((thread *)((long)&buf.field_2 + 8),(type *)&local_e0,&local_a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)auStack_78,&local_a0);
        if (*(long *)((long)__s + uVar15 * 8) != 0) goto LAB_00105748;
        *(undefined8 *)((long)__s + uVar15 * 8) = buf.field_2._8_8_;
        iVar19 = iVar19 - iVar18;
        *(undefined8 *)((long)__s + -8) = 0x1055a0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_78);
        uVar15 = uVar15 + 1;
      } while (uVar15 < (ulong)(long)this->max_threads);
    }
    if (this->max_threads != 0) {
      uVar15 = 0;
      puVar16 = local_90;
      do {
        *(undefined8 *)((long)__s + -8) = 0x1055d3;
        std::thread::join();
        p_Var4 = (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
        uVar1 = (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
        uVar3 = *(undefined8 *)(puVar16 + -6);
        auVar5 = *(undefined1 (*) [8])(puVar16 + -2);
        uVar2 = *puVar16;
        uVar9 = card_storage.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start._4_4_;
        card_storage.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(card_storage.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar2);
        auStack_78._0_4_ = SUB84(auVar5,0);
        auStack_78._4_4_ = (undefined4)((ulong)auVar5 >> 0x20);
        uVar8 = auStack_78._4_4_;
        *(undefined4 *)((long)__s + -0x10) = auStack_78._0_4_;
        auStack_78 = auVar5;
        *(undefined4 *)((long)__s + -0xc) = uVar8;
        *(undefined4 *)((long)__s + -8) = uVar2;
        *(undefined4 *)((long)__s + -4) = uVar9;
        *(undefined8 *)((long)__s + -0x18) = 0x105605;
        std::vector<bool,_std::allocator<bool>_>::_M_insert_range<std::_Bit_iterator>
                  (__return_storage_ptr__,p_Var4,uVar1,uVar3,0);
        uVar15 = uVar15 + 1;
        puVar16 = puVar16 + 10;
      } while (uVar15 < (ulong)(long)this->max_threads);
    }
    puVar7 = local_98;
    if (uVar21 != 0) {
      lVar22 = uVar21 << 3;
      do {
        if (*(long *)((long)__s + lVar22 + -8) != 0) {
LAB_00105748:
          *(undefined1 **)((long)__s + -8) = &LAB_0010574d;
          std::terminate();
        }
        lVar22 = lVar22 + -8;
      } while (lVar22 != 0);
    }
    if ((*(uint *)(fp + *(long *)(*(long *)fp + -0x18) + 0x20) & 2) != 0) {
      if (local_80 != 0) {
        lVar22 = local_80 * 0x28;
        do {
          *(undefined8 *)(puVar7 + -8) = 0x105681;
          std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
                    ((_Bvector_base<std::allocator<bool>_> *)((long)&_Stack_110 + lVar22 + lVar6));
          lVar22 = lVar22 + -0x28;
        } while (lVar22 != 0);
      }
      auVar5 = local_d0;
      if (local_d0 != (undefined1  [8])&buf._M_string_length) {
        *(undefined8 *)(local_88 + -8) = 0x1056a3;
        operator_delete((void *)auVar5);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::vector<bool> xcardMT::validateFromFile(std::ifstream &fp)
{

    //declare buf to store string from file!
    std::string buf;

    //to join indv. results from threads.
    std::vector<bool> final_result;

    //counter vars
    int line_counter = 0;

    //initial line counting
    while (getline(fp, buf))
    {
        line_counter++;
    }

    //clear and reset file
    fp.clear();
    fp.seekg(0, std::ios::beg);

    //init. threads and results vector.

    //if max_threads < 0 set to no of cpu of system.
    if (this->max_threads <= 0){
        this->max_threads = std::thread::hardware_concurrency();
    }


    std::vector<bool> results[this->max_threads];

    if (this->debug)
    {
        std::cout << "[DEBUG] TotalLines=" << line_counter << std::endl;
        std::cout << "[DEBUG] max_threads=" << this->max_threads << std::endl;
    }


    while(true){

        //set max_threads and per_thread;
        long int per_thread = line_counter / this->max_threads;

        if (per_thread <= this->max_threads){
            this->max_threads = 1;
            per_thread = line_counter;
        }

        std::thread threads[this->max_threads];
        
        //debug
        //std::cout << "per_thread= " << per_thread << " max_threads=" << this->max_threads << std::endl;

        for (size_t thread_id = 0; thread_id < this->max_threads; thread_id++)
        {
            //declare storage
            std::vector<std::string> card_storage;

            int pt_counter = 0;

            //get lines and store in storage (check for eof)
        while (pt_counter < per_thread && !fp.eof())
        {
            getline(fp, buf);
            card_storage.push_back(buf);
            pt_counter++;
        }

        //dispatch
        threads[thread_id] = std::thread(&xcardMT::runner, this, card_storage, &results[thread_id]);
        line_counter -= pt_counter;

        }

        //join and add result to final_result
        for (size_t i = 0; i < this->max_threads; i++)
        {
            threads[i].join();
            final_result.insert(final_result.end(), results[i].begin(), results[i].end());
        }
        

        //if not eof - continue
        if(fp.eof()){
            break;
        }else{
            continue;
        }


    } //end while

    return final_result;
}